

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_newclass(HSQUIRRELVM v,SQBool hasbase)

{
  SQRESULT SVar1;
  long in_RSI;
  SQVM *in_RDI;
  SQClass *newclass;
  SQObjectPtr *base;
  SQClass *baseclass;
  SQClass *in_stack_ffffffffffffff98;
  SQSharedState *in_stack_ffffffffffffffa0;
  SQObjectPtr local_40;
  SQClass *local_30;
  SQObjectPtr *local_28;
  SQTable *local_20;
  SQVM *local_10;
  
  local_20 = (SQTable *)0x0;
  local_10 = in_RDI;
  if (in_RSI != 0) {
    local_28 = stack_get((HSQUIRRELVM)in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98
                        );
    if ((local_28->super_SQObject)._type != OT_CLASS) {
      SVar1 = sq_throwerror((HSQUIRRELVM)in_stack_ffffffffffffffa0,
                            (SQChar *)in_stack_ffffffffffffff98);
      return SVar1;
    }
    local_20 = (local_28->super_SQObject)._unVal.pTable;
  }
  local_30 = SQClass::Create(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (local_20 != (SQTable *)0x0) {
    SQVM::Pop((SQVM *)0x10ac28);
  }
  SQObjectPtr::SQObjectPtr(&local_40,local_30);
  SQVM::Push(local_10,(SQObjectPtr *)in_stack_ffffffffffffff98);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
  return 0;
}

Assistant:

SQRESULT sq_newclass(HSQUIRRELVM v,SQBool hasbase)
{
    SQClass *baseclass = NULL;
    if(hasbase) {
        SQObjectPtr &base = stack_get(v,-1);
        if(sq_type(base) != OT_CLASS)
            return sq_throwerror(v,_SC("invalid base type"));
        baseclass = _class(base);
    }
    SQClass *newclass = SQClass::Create(_ss(v), baseclass);
    if(baseclass) v->Pop();
    v->Push(newclass);
    return SQ_OK;
}